

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O0

Mat * __thiscall ncnn::Mat::reshape(Mat *this,int _w,int _h,int _c,Allocator *_allocator)

{
  int in_ECX;
  int in_EDX;
  Allocator *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  undefined8 in_R9;
  int iVar1;
  bool bVar2;
  Mat tmp;
  void *mptr;
  void *ptr;
  int i;
  Mat *m;
  undefined8 in_stack_fffffffffffffdb0;
  size_t in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  Mat *in_stack_fffffffffffffdd0;
  undefined8 *puVar3;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  undefined4 local_1c0;
  int in_stack_fffffffffffffe44;
  Mat *in_stack_fffffffffffffe48;
  long *local_1a0;
  int local_164;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  int in_stack_fffffffffffffec0;
  
  iVar1 = (int)((ulong)in_R9 >> 0x20);
  if (*(int *)((long)&in_RSI[5]._vptr_Allocator + 4) * *(int *)&in_RSI[6]._vptr_Allocator *
      *(int *)((long)&in_RSI[6]._vptr_Allocator + 4) * *(int *)&in_RSI[7]._vptr_Allocator ==
      in_EDX * in_ECX * in_R8D) {
    if (*(int *)&in_RSI[5]._vptr_Allocator < 3) {
      if ((long)in_EDX * (long)in_ECX !=
          ((long)in_EDX * (long)in_ECX * (long)in_RSI[2]._vptr_Allocator + 0xfU & 0xfffffffffffffff0
          ) / (ulong)in_RSI[2]._vptr_Allocator) {
        in_RDI->data = (void *)0x0;
        in_RDI->refcount = (int *)0x0;
        in_RDI->elemsize = 0;
        in_RDI->elempack = 0;
        in_RDI->allocator = (Allocator *)0x0;
        in_RDI->dims = 0;
        in_RDI->w = 0;
        in_RDI->h = 0;
        in_RDI->d = 0;
        in_RDI->c = 0;
        in_RDI->cstep = 0;
        create(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8,
               (int)((ulong)in_stack_fffffffffffffdc0 >> 0x20),in_stack_fffffffffffffdb8,
               (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),in_RSI);
        bVar2 = true;
        if (in_RDI->data != (void *)0x0) {
          bVar2 = in_RDI->cstep * (long)in_RDI->c == 0;
        }
        if (bVar2) {
          return in_RDI;
        }
        for (local_164 = 0; local_164 < in_R8D; local_164 = local_164 + 1) {
          memcpy((void *)((long)in_RDI->data + (long)local_164 * in_RDI->cstep * in_RDI->elemsize),
                 (_func_int **)
                 ((long)in_RSI->_vptr_Allocator +
                 (long)local_164 * (long)in_EDX * (long)in_ECX * (long)in_RSI[2]._vptr_Allocator),
                 (long)in_EDX * (long)in_ECX * (long)in_RSI[2]._vptr_Allocator);
        }
        return in_RDI;
      }
    }
    else if (*(int *)&in_RSI[7]._vptr_Allocator != in_R8D) {
      reshape(in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
              (Allocator *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      reshape((Mat *)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_fffffffffffffec0,iVar1,
              (Allocator *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
      puVar3 = (undefined8 *)&local_1c0;
      if (in_stack_fffffffffffffe48 != (Mat *)0x0) {
        LOCK();
        iVar1 = *(int *)&in_stack_fffffffffffffe48->data;
        *(int *)&in_stack_fffffffffffffe48->data = *(int *)&in_stack_fffffffffffffe48->data + -1;
        UNLOCK();
        if (iVar1 == 1) {
          if (local_1a0 == (long *)0x0) {
            if ((void *)CONCAT44(in_stack_fffffffffffffe44,local_1c0) != (void *)0x0) {
              free((void *)CONCAT44(in_stack_fffffffffffffe44,local_1c0));
            }
          }
          else {
            (**(code **)(*local_1a0 + 0x18))
                      (local_1a0,CONCAT44(in_stack_fffffffffffffe44,local_1c0));
          }
        }
      }
      *puVar3 = 0;
      puVar3[2] = 0;
      *(undefined4 *)(puVar3 + 3) = 0;
      *(undefined4 *)(puVar3 + 5) = 0;
      *(undefined4 *)((long)puVar3 + 0x2c) = 0;
      *(undefined4 *)(puVar3 + 6) = 0;
      *(undefined4 *)((long)puVar3 + 0x34) = 0;
      *(undefined4 *)(puVar3 + 7) = 0;
      puVar3[8] = 0;
      puVar3[1] = 0;
      return in_RDI;
    }
    in_RDI->data = in_RSI->_vptr_Allocator;
    in_RDI->refcount = (int *)in_RSI[1]._vptr_Allocator;
    in_RDI->elemsize = (size_t)in_RSI[2]._vptr_Allocator;
    in_RDI->elempack = *(int *)&in_RSI[3]._vptr_Allocator;
    in_RDI->allocator = (Allocator *)in_RSI[4]._vptr_Allocator;
    in_RDI->dims = *(int *)&in_RSI[5]._vptr_Allocator;
    in_RDI->w = *(int *)((long)&in_RSI[5]._vptr_Allocator + 4);
    in_RDI->h = *(int *)&in_RSI[6]._vptr_Allocator;
    in_RDI->d = *(int *)((long)&in_RSI[6]._vptr_Allocator + 4);
    in_RDI->c = *(int *)&in_RSI[7]._vptr_Allocator;
    in_RDI->cstep = (size_t)in_RSI[8]._vptr_Allocator;
    if (in_RDI->refcount != (int *)0x0) {
      LOCK();
      *in_RDI->refcount = *in_RDI->refcount + 1;
      UNLOCK();
    }
    in_RDI->dims = 3;
    in_RDI->w = in_EDX;
    in_RDI->h = in_ECX;
    in_RDI->d = 1;
    in_RDI->c = in_R8D;
    in_RDI->cstep =
         ((long)in_EDX * (long)in_ECX * (long)in_RSI[2]._vptr_Allocator + 0xfU & 0xfffffffffffffff0)
         / (ulong)in_RSI[2]._vptr_Allocator;
  }
  else {
    in_RDI->data = (void *)0x0;
    in_RDI->refcount = (int *)0x0;
    in_RDI->elemsize = 0;
    in_RDI->elempack = 0;
    in_RDI->allocator = (Allocator *)0x0;
    in_RDI->dims = 0;
    in_RDI->w = 0;
    in_RDI->h = 0;
    in_RDI->d = 0;
    in_RDI->c = 0;
    in_RDI->cstep = 0;
  }
  return in_RDI;
}

Assistant:

Mat Mat::reshape(int _w, int _h, int _c, Allocator* _allocator) const
{
    if (w * h * d * c != _w * _h * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h != alignSize((size_t)_w * _h * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _c, elemsize, elempack, _allocator);
            if (m.empty())
                return m;

            // align channel
            for (int i = 0; i < _c; i++)
            {
                const void* ptr = (unsigned char*)data + (size_t)i * _w * _h * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, (size_t)_w * _h * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _c, _allocator);
        return tmp.reshape(_w, _h, _c, _allocator);
    }

    Mat m = *this;

    m.dims = 3;
    m.w = _w;
    m.h = _h;
    m.d = 1;
    m.c = _c;

    m.cstep = alignSize((size_t)_w * _h * elemsize, 16) / elemsize;

    return m;
}